

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# determinization.cc
# Opt level: O1

size_t re2c::find_state(nfa_state_t **kernel,nfa_state_t **end,ord_hash_set_t *kernels)

{
  long lVar1;
  nfa_state_t **p;
  nfa_state_t **ppnVar2;
  ulong uVar3;
  size_t sVar4;
  
  ppnVar2 = kernel;
  if (kernel == end) {
    return 0xffffffffffffffff;
  }
  do {
    (*ppnVar2)->mark = false;
    ppnVar2 = ppnVar2 + 1;
  } while (ppnVar2 != end);
  if (kernel != end) {
    uVar3 = (long)end - (long)kernel >> 3;
    lVar1 = 0x3f;
    if (uVar3 != 0) {
      for (; uVar3 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    std::__introsort_loop<re2c::nfa_state_t**,long,__gnu_cxx::__ops::_Iter_less_iter>
              (kernel,end,((uint)lVar1 ^ 0x3f) * 2 ^ 0x7e);
    std::__final_insertion_sort<re2c::nfa_state_t**,__gnu_cxx::__ops::_Iter_less_iter>(kernel,end);
  }
  sVar4 = ord_hash_set_t::insert(kernels,kernel,(long)end - (long)kernel);
  return sVar4;
}

Assistant:

static size_t find_state
	( nfa_state_t **kernel
	, nfa_state_t **end
	, ord_hash_set_t &kernels
	)
{
	// zero-sized kernel corresponds to default state
	if (kernel == end)
	{
		return dfa_t::NIL;
	}

	// see note [marking DFA states]
	for (nfa_state_t **p = kernel; p != end; ++p)
	{
		(*p)->mark = false;
	}

	// sort kernel states: we need this to get stable hash
	// and to compare states with simple 'memcmp'
	std::sort(kernel, end);
	const size_t size = static_cast<size_t>(end - kernel) * sizeof(nfa_state_t*);
	return kernels.insert(kernel, size);
}